

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

void __thiscall
Compiler::processFunction
          (Compiler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *line,bool destroyReturnValue)

{
  InstructionGenerator *this_00;
  string *identifier;
  pointer puVar1;
  pointer puVar2;
  pointer pbVar3;
  pointer pcVar4;
  pointer puVar5;
  DataType DVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  Scope *pSVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  string local_d8;
  Scope *local_b8;
  string local_b0;
  Variable local_90;
  Variable local_60;
  
  DVar6 = stringToDataType((line->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start);
  identifier = (line->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
  if (((DVar6 == UNKNOWN) ||
      ((ulong)((long)(line->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)identifier) < 0x41)) ||
     (*identifier[2]._M_dataplus._M_p != '(')) {
    pSVar10 = getPastScope(this,identifier);
    if (pSVar10 == (Scope *)0x0) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      std::operator+(&local_d8,"Failed to find entry point for \'",
                     (line->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
      std::operator+(__return_storage_ptr__,&local_d8,"\'");
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
    if (pSVar10->returnType != VOID) {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
      InstructionGenerator::genCreateDefaultValue(&this->igen,&local_d8,pSVar10->returnType);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
    }
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"functionEnd","");
    this_00 = &this->igen;
    InstructionGenerator::genCreateInt(this_00,&local_d8,0);
    local_b8 = pSVar10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    puVar1 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar2 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar8 = VirtualStack::getStackSize(&this_00->super_VirtualStack);
    pbVar3 = (line->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pcVar4 = pbVar3[1]._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar4,pcVar4 + pbVar3[1]._M_string_length);
    evaluateBracket(this,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    uVar9 = VirtualStack::getStackSize(&this_00->super_VirtualStack);
    iVar7 = uVar9 - uVar8;
    if (uVar8 <= uVar9 && iVar7 != 0) {
      do {
        VirtualStack::pop(&local_90,&this_00->super_VirtualStack);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.identifier._M_dataplus._M_p != &local_90.identifier.field_2) {
          operator_delete(local_90.identifier._M_dataplus._M_p);
        }
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
    pSVar10 = local_b8;
    puVar5 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar5[((ulong)((long)puVar1 - (long)puVar2) >> 2) + 0xffffffff & 0xffffffff] =
         (int)((ulong)((long)(this->bytecode).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)puVar5) >> 2) + 2;
    InstructionGenerator::genGoto(this_00,local_b8->startPos);
    VirtualStack::pop(&local_60,&this_00->super_VirtualStack);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.identifier._M_dataplus._M_p != &local_60.identifier.field_2) {
      operator_delete(local_60.identifier._M_dataplus._M_p);
    }
    if (destroyReturnValue && pSVar10->returnType != VOID) {
      InstructionGenerator::genStackWalk(this_00,1);
    }
  }
  else {
    Scope::reset(&this->expectedScopeType);
    (this->expectedScopeType).type = FUNCTION;
    std::__cxx11::string::_M_assign((string *)&(this->expectedScopeType).identifier);
    std::__cxx11::string::_M_assign((string *)&(this->expectedScopeType).incrementor);
    (this->expectedScopeType).returnType = DVar6;
    iVar7 = std::__cxx11::string::compare
                      ((char *)((line->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar7 == 0) {
      puVar1 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar1[1] = (uint)((ulong)((long)(this->bytecode).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >>
                        2);
    }
  }
  return;
}

Assistant:

void Compiler::processFunction(const std::vector<std::string>& line, bool destroyReturnValue)
{
    DataType possibleType = stringToDataType(line[0]);
    if(possibleType != DataType::UNKNOWN && line.size() > 2 && line[2][0] == '(') //If we're defining a function
    {
        //Reset the expected scope
        expectedScopeType.reset();

        //Add the function
        expectedScopeType.type = Scope::FUNCTION; //Store the scope type
        expectedScopeType.identifier = line[1]; //Store the function name
        expectedScopeType.incrementor = line[2]; //Store the function arguments
        expectedScopeType.returnType = possibleType; //Store the return value type

        //If this is the program entry point, update the entry point goto position
        if(line[1] == "entry")
            bytecode[1] = bytecode.size();
    }
    else //Else if we're calling a function
    {
        Scope *scope = getPastScope(line[0]);
        if(scope == nullptr)
            throw std::string("Failed to find entry point for '" + line[0] + "'");

        //Reserve space for return value if needed
        if(scope->returnType != DataType::VOID)
            igen.genCreateDefaultValue("", scope->returnType);

        //Create the exit point
        igen.genCreateInt("functionEnd", 0); //Add a bit for the stack walk below
        unsigned int exitPointPos = bytecode.size()-1;

        //Evaluate arguments, adding to the stack
        unsigned int sizeBeforeEvaluation = igen.getStackSize();
        evaluateBracket(line[1]);
        unsigned int sizeAfterEvaluation = igen.getStackSize();

        //Artificially remove them from the compiler's stack, as the values are already cleaned up by the function scope end
        for(unsigned int a = sizeBeforeEvaluation; a < sizeAfterEvaluation; a++)
            igen.pop();

        //update the exit point position
        bytecode[exitPointPos] = bytecode.size()+2;

        //Goto the function
        igen.genGoto(scope->startPos);

        //Remove exit point, it will have been used by the function
        igen.pop();

        //Remove return value if specified
        if(scope->returnType != DataType::VOID && destroyReturnValue)
        {
            igen.genStackWalk(1);
        }
    }
}